

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physical_batch_copy_to_file.cpp
# Opt level: O1

SourceResultType __thiscall
duckdb::PhysicalBatchCopyToFile::GetData
          (PhysicalBatchCopyToFile *this,ExecutionContext *context,DataChunk *chunk,
          OperatorSourceInput *input)

{
  CopyFunctionReturnType CVar1;
  pointer pcVar2;
  pointer pGVar3;
  long lVar4;
  pointer this_00;
  type info;
  NotImplementedException *this_01;
  __pthread_list_t *this_02;
  vector<duckdb::Value,_true> file_list;
  string fp;
  pointer local_d8;
  pointer pVStack_d0;
  pointer local_c8;
  Value local_c0;
  string local_80;
  LogicalType local_60;
  vector<duckdb::Value,_true> local_48;
  
  pGVar3 = unique_ptr<duckdb::GlobalSinkState,_std::default_delete<duckdb::GlobalSinkState>,_true>::
           operator->(&(this->super_PhysicalOperator).sink_state);
  if (this->use_tmp_file == true) {
    PhysicalCopyToFile::GetNonTmpFile(&local_80,context->client,&this->file_path);
  }
  else {
    local_80._M_dataplus._M_p = (pointer)&local_80.field_2;
    pcVar2 = (this->file_path)._M_dataplus._M_p;
    ::std::__cxx11::string::_M_construct<char*>
              ((string *)&local_80,pcVar2,pcVar2 + (this->file_path)._M_string_length);
  }
  CVar1 = this->return_type;
  if (CVar1 == WRITTEN_FILE_STATISTICS) {
    if (pGVar3[6].super_StateWithBlockableTasks.lock.super___mutex_base._M_mutex.__data.__list.
        __prev == (__pthread_internal_list *)0x0) goto LAB_016e57ef;
    this_02 = &pGVar3[6].super_StateWithBlockableTasks.lock.super___mutex_base._M_mutex.__data.
               __list;
    this_00 = unique_ptr<duckdb::CopyToFileInfo,_std::default_delete<duckdb::CopyToFileInfo>,_true>
              ::operator->((unique_ptr<duckdb::CopyToFileInfo,_std::default_delete<duckdb::CopyToFileInfo>,_true>
                            *)this_02);
    ::std::__cxx11::string::operator=((string *)this_00,(string *)&local_80);
    info = unique_ptr<duckdb::CopyToFileInfo,_std::default_delete<duckdb::CopyToFileInfo>,_true>::
           operator*((unique_ptr<duckdb::CopyToFileInfo,_std::default_delete<duckdb::CopyToFileInfo>,_true>
                      *)this_02);
    PhysicalCopyToFile::ReturnStatistics(chunk,0,info);
  }
  else {
    if (CVar1 == CHANGED_ROWS_AND_FILE_LIST) {
      local_d8 = (pointer)0x0;
      pVStack_d0 = (pointer)0x0;
      local_c8 = (pointer)0x0;
      if (pGVar3[4].super_StateWithBlockableTasks.blocked_tasks.
          super_vector<duckdb::InterruptState,_std::allocator<duckdb::InterruptState>_>.
          super__Vector_base<duckdb::InterruptState,_std::allocator<duckdb::InterruptState>_>.
          _M_impl.super__Vector_impl_data._M_end_of_storage != (pointer)0x0) {
        ::std::vector<duckdb::Value,std::allocator<duckdb::Value>>::
        emplace_back<std::__cxx11::string>
                  ((vector<duckdb::Value,std::allocator<duckdb::Value>> *)&local_d8,&local_80);
      }
      lVar4 = NumericCastImpl<long,_unsigned_long,_false>::Convert
                        ((unsigned_long)
                         pGVar3[4].super_StateWithBlockableTasks.blocked_tasks.
                         super_vector<duckdb::InterruptState,_std::allocator<duckdb::InterruptState>_>
                         .
                         super__Vector_base<duckdb::InterruptState,_std::allocator<duckdb::InterruptState>_>
                         ._M_impl.super__Vector_impl_data._M_finish);
      Value::BIGINT(&local_c0,lVar4);
      DataChunk::SetValue(chunk,0,0,&local_c0);
      Value::~Value(&local_c0);
      LogicalType::LogicalType(&local_60,VARCHAR);
      local_48.super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>.
      super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.
      super__Vector_impl_data._M_start = local_d8;
      local_48.super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>.
      super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.
      super__Vector_impl_data._M_finish = pVStack_d0;
      local_48.super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>.
      super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = local_c8;
      local_d8 = (pointer)0x0;
      pVStack_d0 = (pointer)0x0;
      local_c8 = (pointer)0x0;
      Value::LIST(&local_c0,&local_60,&local_48);
      DataChunk::SetValue(chunk,1,0,&local_c0);
      Value::~Value(&local_c0);
      ::std::vector<duckdb::Value,_std::allocator<duckdb::Value>_>::~vector
                ((vector<duckdb::Value,_std::allocator<duckdb::Value>_> *)&local_48);
      LogicalType::~LogicalType(&local_60);
      chunk->count = 1;
      ::std::vector<duckdb::Value,_std::allocator<duckdb::Value>_>::~vector
                ((vector<duckdb::Value,_std::allocator<duckdb::Value>_> *)&local_d8);
      goto LAB_016e57ef;
    }
    if (CVar1 != CHANGED_ROWS) {
      this_01 = (NotImplementedException *)__cxa_allocate_exception(0x10);
      local_c0.type_._0_8_ = (long)&local_c0 + 0x10;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_c0,"Unknown CopyFunctionReturnType","");
      NotImplementedException::NotImplementedException(this_01,(string *)&local_c0);
      __cxa_throw(this_01,&NotImplementedException::typeinfo,::std::runtime_error::~runtime_error);
    }
    lVar4 = NumericCastImpl<long,_unsigned_long,_false>::Convert
                      ((unsigned_long)
                       pGVar3[4].super_StateWithBlockableTasks.blocked_tasks.
                       super_vector<duckdb::InterruptState,_std::allocator<duckdb::InterruptState>_>
                       .
                       super__Vector_base<duckdb::InterruptState,_std::allocator<duckdb::InterruptState>_>
                       ._M_impl.super__Vector_impl_data._M_finish);
    Value::BIGINT(&local_c0,lVar4);
    DataChunk::SetValue(chunk,0,0,&local_c0);
    Value::~Value(&local_c0);
  }
  chunk->count = 1;
LAB_016e57ef:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_80._M_dataplus._M_p != &local_80.field_2) {
    operator_delete(local_80._M_dataplus._M_p);
  }
  return FINISHED;
}

Assistant:

SourceResultType PhysicalBatchCopyToFile::GetData(ExecutionContext &context, DataChunk &chunk,
                                                  OperatorSourceInput &input) const {
	auto &g = sink_state->Cast<FixedBatchCopyGlobalState>();
	auto fp = use_tmp_file ? PhysicalCopyToFile::GetNonTmpFile(context.client, file_path) : file_path;
	switch (return_type) {
	case CopyFunctionReturnType::CHANGED_ROWS:
		chunk.SetValue(0, 0, Value::BIGINT(NumericCast<int64_t>(g.rows_copied.load())));
		chunk.SetCardinality(1);
		break;
	case CopyFunctionReturnType::CHANGED_ROWS_AND_FILE_LIST: {
		vector<Value> file_list;
		if (g.global_state) {
			file_list.emplace_back(std::move(fp));
		}
		chunk.SetValue(0, 0, Value::BIGINT(NumericCast<int64_t>(g.rows_copied.load())));
		chunk.SetValue(1, 0, Value::LIST(LogicalType::VARCHAR, std::move(file_list)));
		chunk.SetCardinality(1);
		break;
	}
	case CopyFunctionReturnType::WRITTEN_FILE_STATISTICS: {
		if (g.written_file_info) {
			g.written_file_info->file_path = std::move(fp);
			PhysicalCopyToFile::ReturnStatistics(chunk, 0, *g.written_file_info);
			chunk.SetCardinality(1);
		}
		break;
	}
	default:
		throw NotImplementedException("Unknown CopyFunctionReturnType");
	}

	return SourceResultType::FINISHED;
}